

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

StringRef Catch::trim(StringRef ref)

{
  char cVar1;
  StringRef *pSVar2;
  StringRef SVar3;
  size_t real_end;
  size_t real_begin;
  anon_class_1_0_00000001 is_ws;
  size_type in_stack_ffffffffffffffa8;
  uint7 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb7;
  bool bVar4;
  undefined7 in_stack_ffffffffffffffc0;
  undefined1 uVar5;
  StringRef *pSVar6;
  StringRef *this;
  anon_class_1_0_00000001 local_21;
  StringRef local_20 [2];
  
  pSVar6 = (StringRef *)0x0;
  while( true ) {
    this = pSVar6;
    pSVar2 = (StringRef *)StringRef::size(local_20);
    uVar5 = false;
    if (pSVar6 < pSVar2) {
      cVar1 = StringRef::operator[]
                        ((StringRef *)CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),
                         in_stack_ffffffffffffffa8);
      uVar5 = trim::anon_class_1_0_00000001::operator()(&local_21,cVar1);
    }
    if ((bool)uVar5 == false) break;
    pSVar6 = (StringRef *)((long)&this->m_start + 1);
  }
  pSVar6 = (StringRef *)StringRef::size(local_20);
  while( true ) {
    bVar4 = false;
    if (this < pSVar6) {
      cVar1 = StringRef::operator[]
                        ((StringRef *)(ulong)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
      bVar4 = trim::anon_class_1_0_00000001::operator()(&local_21,cVar1);
    }
    if (bVar4 == false) break;
    pSVar6 = (StringRef *)((long)&pSVar6[-1].m_size + 7);
  }
  SVar3 = StringRef::substr(this,(size_type)pSVar6,CONCAT17(uVar5,in_stack_ffffffffffffffc0));
  return SVar3;
}

Assistant:

StringRef trim(StringRef ref) {
        const auto is_ws = [](char c) {
            return c == ' ' || c == '\t' || c == '\n' || c == '\r';
        };
        size_t real_begin = 0;
        while (real_begin < ref.size() && is_ws(ref[real_begin])) { ++real_begin; }
        size_t real_end = ref.size();
        while (real_end > real_begin && is_ws(ref[real_end - 1])) { --real_end; }

        return ref.substr(real_begin, real_end - real_begin);
    }